

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall
TPZSkylMatrix<std::complex<double>_>::PutVal
          (TPZSkylMatrix<std::complex<double>_> *this,int64_t r,int64_t c,complex<double> *value)

{
  complex<double> *pcVar1;
  complex<double> a;
  bool bVar2;
  TPZSkylMatrix<std::complex<double>_> *this_00;
  int64_t iVar3;
  ostream *this_01;
  complex<double> **ppcVar4;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int64_t index;
  int64_t col;
  int64_t row;
  char *in_stack_00000188;
  char *in_stack_00000190;
  int64_t in_stack_ffffffffffffff98;
  TPZSkylMatrix<std::complex<double>_> *this_02;
  long local_38;
  long local_30;
  undefined8 *local_28;
  
  local_38 = in_RDX;
  local_30 = in_RSI;
  local_28 = in_RCX;
  if (in_RDX < in_RSI) {
    TPZMatrix<std::complex<double>_>::Swap(&local_30,&local_38);
  }
  this_00 = (TPZSkylMatrix<std::complex<double>_> *)(local_38 - local_30);
  this_02 = this_00;
  iVar3 = Size(this_00,in_stack_ffffffffffffff98);
  if (((long)this_02 < iVar3) ||
     (a._M_value._8_8_ = this_02, a._M_value._0_8_ = in_stack_ffffffffffffff98, bVar2 = IsZero(a),
     bVar2)) {
    iVar3 = Size(this_02,in_stack_ffffffffffffff98);
    if (iVar3 <= (long)this_00) {
      return 1;
    }
  }
  else {
    this_01 = std::operator<<((ostream *)&std::cout,"TPZSkylMatrix::PutVal Size");
    iVar3 = Size(this_02,(int64_t)this_01);
    std::ostream::operator<<(this_01,iVar3);
    std::ostream::flush();
    TPZMatrix<std::complex<double>_>::Error(in_stack_00000190,in_stack_00000188);
  }
  ppcVar4 = TPZVec<std::complex<double>_*>::operator[]
                      ((TPZVec<std::complex<double>_*> *)(in_RDI + 0x20),local_38);
  pcVar1 = *ppcVar4;
  *(undefined8 *)pcVar1[(long)this_00]._M_value = *local_28;
  *(undefined8 *)(pcVar1[(long)this_00]._M_value + 8) = local_28[1];
  *(undefined1 *)(in_RDI + 0x18) = 0;
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::PutVal(const int64_t r,const int64_t c,const TVar & value )
{
	// inicializando row e col para trabalhar com a triangular superior
	int64_t row(r),col(c);
	if ( row > col )
		this->Swap( &row, &col );
	
	// Indice do vetor coluna.
	int64_t index = col - row;
	// Se precisar redimensionar o vetor.
	//EBORIN: Do we really need to check this?
	if ( index >= Size(col) && !IsZero(value)) {
		cout << "TPZSkylMatrix::PutVal Size" << Size(col);
		cout.flush();
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"Index out of range");
	} else if(index >= Size(col)) return 1;
	fElem[col][index] = value;
	//  delete[]newVet;
	this->fDecomposed = 0;
	return( 1 );
}